

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void reset_weak_ref(JSRuntime *rt,JSObject *p)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  JSMapRecord *pJVar4;
  int64_t iVar5;
  JSValueUnion JVar6;
  JSMapRecord *pJVar7;
  JSValue v;
  
  pJVar7 = p->first_weak_ref;
  if (pJVar7 != (JSMapRecord *)0x0) {
    do {
      plVar2 = (pJVar7->hash_link).prev;
      plVar3 = (pJVar7->hash_link).next;
      plVar2->next = plVar3;
      plVar3->prev = plVar2;
      (pJVar7->hash_link).prev = (list_head *)0x0;
      (pJVar7->hash_link).next = (list_head *)0x0;
      plVar2 = (pJVar7->link).prev;
      plVar3 = (pJVar7->link).next;
      plVar2->next = plVar3;
      plVar3->prev = plVar2;
      (pJVar7->link).prev = (list_head *)0x0;
      (pJVar7->link).next = (list_head *)0x0;
      pJVar7 = pJVar7->next_weak_ref;
    } while (pJVar7 != (JSMapRecord *)0x0);
    if (p->first_weak_ref != (JSMapRecord *)0x0) {
      pJVar7 = p->first_weak_ref;
      do {
        pJVar4 = pJVar7->next_weak_ref;
        iVar5 = (pJVar7->value).tag;
        if (0xfffffff4 < (uint)iVar5) {
          JVar6 = (JSValueUnion)(pJVar7->value).u.ptr;
          iVar1 = *JVar6.ptr;
          *(int *)JVar6.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            v.tag = iVar5;
            v.u.ptr = JVar6.ptr;
            __JS_FreeValueRT(rt,v);
          }
        }
        (*(rt->mf).js_free)(&rt->malloc_state,pJVar7);
        pJVar7 = pJVar4;
      } while (pJVar4 != (JSMapRecord *)0x0);
    }
  }
  p->first_weak_ref = (JSMapRecord *)0x0;
  return;
}

Assistant:

static void reset_weak_ref(JSRuntime *rt, JSObject *p)
{
    JSMapRecord *mr, *mr_next;
    JSMapState *s;
    
    /* first pass to remove the records from the WeakMap/WeakSet
       lists */
    for(mr = p->first_weak_ref; mr != NULL; mr = mr->next_weak_ref) {
        s = mr->map;
        assert(s->is_weak);
        assert(!mr->empty); /* no iterator on WeakMap/WeakSet */
        list_del(&mr->hash_link);
        list_del(&mr->link);
    }
    
    /* second pass to free the values to avoid modifying the weak
       reference list while traversing it. */
    for(mr = p->first_weak_ref; mr != NULL; mr = mr_next) {
        mr_next = mr->next_weak_ref;
        JS_FreeValueRT(rt, mr->value);
        js_free_rt(rt, mr);
    }

    p->first_weak_ref = NULL; /* fail safe */
}